

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.h
# Opt level: O0

string * __thiscall re2c::Opt::yychConversion_abi_cxx11_(string *__return_storage_ptr__,Opt *this)

{
  opt_t *poVar1;
  allocator<char> local_4d [20];
  byte local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Opt *local_18;
  Opt *this_local;
  
  local_18 = this;
  this_local = (Opt *)__return_storage_ptr__;
  poVar1 = realopt_t::operator->(&this->realopt);
  local_39 = 0;
  if ((poVar1->yychConversion & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_4d)
    ;
    std::allocator<char>::~allocator(local_4d);
  }
  else {
    poVar1 = realopt_t::operator->(&this->realopt);
    std::operator+(&local_38,"(",&poVar1->yyctype);
    local_39 = 1;
    std::operator+(__return_storage_ptr__,&local_38,")");
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string yychConversion ()
	{
		return realopt->yychConversion
			? "(" + realopt->yyctype + ")"
			: "";
	}